

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdNode.cpp
# Opt level: O1

FindResult * __thiscall
KdNode::findInTriangles
          (FindResult *__return_storage_ptr__,KdNode *this,Segment seg,Triangle *excludedTriangle,
          float t_enter,float t_exit)

{
  pointer pTVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  bool bVar13;
  pointer this_00;
  IntersecRes local_5c;
  Point *local_48;
  float local_40;
  float local_3c;
  float local_38;
  undefined4 local_34;
  
  __return_storage_ptr__->exists = false;
  (__return_storage_ptr__->triangle).normal.x = 0.0;
  (__return_storage_ptr__->triangle).normal.y = 0.0;
  (__return_storage_ptr__->triangle).normal.z = 0.0;
  (__return_storage_ptr__->triangle).x.x = 0.0;
  (__return_storage_ptr__->triangle).x.y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->triangle).x.z = 0;
  (__return_storage_ptr__->triangle).y.y = 0.0;
  (__return_storage_ptr__->triangle).y.z = 0.0;
  (__return_storage_ptr__->triangle).z.x = 0.0;
  (__return_storage_ptr__->triangle).z.y = 0.0;
  *(undefined8 *)((long)&(__return_storage_ptr__->triangle).z.y + 1) = 0;
  *(undefined8 *)&(__return_storage_ptr__->triangle).colorX.g = 0;
  *(undefined8 *)&(__return_storage_ptr__->triangle).reflectionCoefficient = 0x3dcccccd;
  (__return_storage_ptr__->point).y = 0.0;
  (__return_storage_ptr__->point).z = 0.0;
  this_00 = (this->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar1 = (this->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_34 = 0;
  if (this_00 != pTVar1) {
    local_48 = &__return_storage_ptr__->point;
    local_38 = 3.4028235e+38;
    local_40 = t_exit;
    local_3c = t_enter;
    do {
      bVar13 = Triangle::operator==(this_00,excludedTriangle);
      if (!bVar13) {
        intersectionT(&local_5c,&seg,this_00);
        if ((((local_5c.exists == true) && (local_5c.t <= local_40)) && (local_5c.t < local_38)) &&
           (local_3c <= local_5c.t)) {
          local_48->z = local_5c.point.z;
          local_48->x = local_5c.point.x;
          local_48->y = local_5c.point.y;
          fVar11 = (this_00->x).x;
          fVar12 = (this_00->x).y;
          uVar2 = *(undefined8 *)&(this_00->x).z;
          fVar7 = (this_00->y).y;
          fVar8 = (this_00->y).z;
          fVar9 = (this_00->z).x;
          fVar10 = (this_00->z).y;
          uVar3 = *(undefined8 *)&(this_00->z).z;
          uVar4 = *(undefined8 *)&(this_00->colorY).g;
          fVar6 = (this_00->normal).y;
          uVar5 = *(undefined8 *)&(this_00->normal).z;
          (__return_storage_ptr__->triangle).normal.x = (this_00->normal).x;
          (__return_storage_ptr__->triangle).normal.y = fVar6;
          *(undefined8 *)&(__return_storage_ptr__->triangle).normal.z = uVar5;
          *(undefined8 *)&(__return_storage_ptr__->triangle).z.z = uVar3;
          *(undefined8 *)&(__return_storage_ptr__->triangle).colorY.g = uVar4;
          (__return_storage_ptr__->triangle).y.y = fVar7;
          (__return_storage_ptr__->triangle).y.z = fVar8;
          (__return_storage_ptr__->triangle).z.x = fVar9;
          (__return_storage_ptr__->triangle).z.y = fVar10;
          (__return_storage_ptr__->triangle).x.x = fVar11;
          (__return_storage_ptr__->triangle).x.y = fVar12;
          *(undefined8 *)&(__return_storage_ptr__->triangle).x.z = uVar2;
          local_34 = (undefined4)CONCAT71(local_5c.point._1_7_,1);
          local_38 = local_5c.t;
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != pTVar1);
  }
  __return_storage_ptr__->exists = SUB41(local_34,0);
  return __return_storage_ptr__;
}

Assistant:

FindResult KdNode::findInTriangles(Segment seg, Triangle const& excludedTriangle, float t_enter, float t_exit)
{
  FindResult res{};

  float currDist = std::numeric_limits<float>::max();

  for (auto const& triangle : triangles)
  {
    if (triangle == excludedTriangle)
      continue;
    IntersecRes const& intersec = intersectionT(seg, triangle);

    if (intersec.exists && intersec.t < currDist && intersec.t >= t_enter && intersec.t <= t_exit)
    {
      currDist = intersec.t;
      res.exists = true;
      res.point = intersec.point;
      res.triangle = triangle;
    }
  }

  return res;
}